

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + piVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int EvalLog::GetNumCompletedRuns() const {
	int num = 0;
	for (int i = 0; i < num_of_completed_runs.size(); i++)
		num += num_of_completed_runs[i];
	return num;
}